

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.hpp
# Opt level: O0

void __thiscall JEBDebug::Profiler::end_timer(Profiler *this)

{
  iterator total_time;
  bool bVar1;
  reference pvVar2;
  __tuple_element_t<0UL,_tuple<ProfilerSection,_time_point<system_clock,_duration<long,_ratio<1L,_1000000000L>_>_>,_duration<long,_ratio<1L,_1000000000L>_>_>_>
  *__x;
  __tuple_element_t<1UL,_tuple<ProfilerSection,_time_point<system_clock,_duration<long,_ratio<1L,_1000000000L>_>_>,_duration<long,_ratio<1L,_1000000000L>_>_>_>
  *__rhs;
  __tuple_element_t<2UL,_tuple<ProfilerSection,_time_point<system_clock,_duration<long,_ratio<1L,_1000000000L>_>_>,_duration<long,_ratio<1L,_1000000000L>_>_>_>
  *p_Var3;
  pointer ppVar4;
  type time;
  pair<std::_Rb_tree_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_bool>
  pVar5;
  _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
  local_98;
  _Base_ptr local_90;
  undefined1 local_88;
  ProfilerData local_80;
  _Base_ptr local_60;
  undefined1 local_58;
  _Self local_50;
  _Self local_48;
  iterator it;
  type elapsed;
  type *sub_duration;
  type *start_time;
  type *key;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point end_time;
  Profiler *this_local;
  
  end_time.__d.__r = (duration)(duration)this;
  local_18.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  pvVar2 = std::
           vector<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
           ::back(&this->call_stack_);
  __x = std::
        get<0ul,JEBDebug::ProfilerSection,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  (pvVar2);
  __rhs = std::
          get<1ul,JEBDebug::ProfilerSection,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (pvVar2);
  p_Var3 = std::
           get<2ul,JEBDebug::ProfilerSection,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                     (pvVar2);
  it._M_node = (_Base_ptr)std::chrono::operator-(&local_18,__rhs);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<JEBDebug::ProfilerSection,_JEBDebug::ProfilerData,_std::less<JEBDebug::ProfilerSection>,_std::allocator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>
       ::find(&this->profiles_,__x);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<JEBDebug::ProfilerSection,_JEBDebug::ProfilerData,_std::less<JEBDebug::ProfilerSection>,_std::allocator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>
       ::end(&this->profiles_);
  bVar1 = std::operator==(&local_48,&local_50);
  if (bVar1) {
    ProfilerData::ProfilerData(&local_80);
    pVar5 = std::
            map<JEBDebug::ProfilerSection,JEBDebug::ProfilerData,std::less<JEBDebug::ProfilerSection>,std::allocator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>>
            ::emplace<JEBDebug::ProfilerSection&,JEBDebug::ProfilerData>
                      ((map<JEBDebug::ProfilerSection,JEBDebug::ProfilerData,std::less<JEBDebug::ProfilerSection>,std::allocator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>>
                        *)&this->profiles_,__x,&local_80);
    local_90 = (_Base_ptr)pVar5.first._M_node;
    local_88 = pVar5.second;
    local_60 = local_90;
    local_58 = local_88;
    local_48._M_node = local_90;
    std::
    _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>::
    _Rb_tree_const_iterator(&local_98,&local_48);
    std::
    vector<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
    ::push_back(&this->sequence_,&local_98);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>::
           operator->(&local_48);
  total_time = it;
  time = std::chrono::operator-((duration<long,_std::ratio<1L,_1000000000L>_> *)&it,p_Var3);
  ProfilerData::add_time(&ppVar4->second,(Duration)total_time._M_node,(Duration)time.__r);
  std::
  vector<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ::pop_back(&this->call_stack_);
  bVar1 = std::
          vector<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
          ::empty(&this->call_stack_);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
             ::back(&this->call_stack_);
    p_Var3 = std::
             get<2ul,JEBDebug::ProfilerSection,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       (pvVar2);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
              (p_Var3,(duration<long,_std::ratio<1L,_1000000000L>_> *)&it);
  }
  return;
}

Assistant:

void end_timer()
        {
            auto end_time = Clock::now();
            auto& [key, start_time, sub_duration] = call_stack_.back();
            auto elapsed = end_time - start_time;
            auto it = profiles_.find(key);
            if (it == profiles_.end())
            {
                it = profiles_.emplace(key, ProfilerData()).first;
                sequence_.push_back(it);
            }
            it->second.add_time(elapsed, elapsed - sub_duration);
            call_stack_.pop_back();
            if (!call_stack_.empty())
                std::get<2>(call_stack_.back()) += elapsed;
        }